

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::sectionEnded(RunContext *this,SectionEndInfo *endInfo)

{
  bool bVar1;
  reference ppIVar2;
  pointer pIVar3;
  RunContext *in_RDI;
  bool missingAssertions;
  Counts assertions;
  Counts *in_stack_ffffffffffffff30;
  undefined1 *puVar4;
  Counts *in_stack_ffffffffffffff40;
  SectionInfo *in_stack_ffffffffffffff48;
  SectionStats *in_stack_ffffffffffffff50;
  
  Counts::operator-(in_stack_ffffffffffffff40,(Counts *)in_RDI);
  testForMissingAssertions(in_RDI,in_stack_ffffffffffffff30);
  bVar1 = clara::std::
          vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
          ::empty((vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
                   *)in_stack_ffffffffffffff40);
  if (!bVar1) {
    ppIVar2 = clara::std::
              vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
              ::back((vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
                      *)in_stack_ffffffffffffff30);
    (*(*ppIVar2)->_vptr_ITracker[8])();
    clara::std::
    vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
    ::pop_back((vector<Catch::TestCaseTracking::ITracker_*,_std::allocator<Catch::TestCaseTracking::ITracker_*>_>
                *)0x275a73);
  }
  pIVar3 = clara::std::
           unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>::
           operator->((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                       *)0x275a84);
  puVar4 = &stack0xffffffffffffff50;
  SectionStats::SectionStats
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,
             (double)in_RDI,SUB81((ulong)puVar4 >> 0x38,0));
  (*pIVar3->_vptr_IStreamingReporter[0xb])(pIVar3,puVar4);
  SectionStats::~SectionStats((SectionStats *)0x275ad5);
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::clear
            ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)0x275ae6);
  clara::std::vector<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_>::clear
            ((vector<Catch::ScopedMessage,_std::allocator<Catch::ScopedMessage>_> *)0x275af7);
  return;
}

Assistant:

void RunContext::sectionEnded(SectionEndInfo const & endInfo) {
        Counts assertions = m_totals.assertions - endInfo.prevAssertions;
        bool missingAssertions = testForMissingAssertions(assertions);

        if (!m_activeSections.empty()) {
            m_activeSections.back()->close();
            m_activeSections.pop_back();
        }

        m_reporter->sectionEnded(SectionStats(endInfo.sectionInfo, assertions, endInfo.durationInSeconds, missingAssertions));
        m_messages.clear();
        m_messageScopes.clear();
    }